

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O0

void __thiscall
QFontComboBox::setSampleTextForSystem
          (QFontComboBox *this,WritingSystem writingSystem,QString *sampleText)

{
  long lVar1;
  QFontComboBoxPrivate *key;
  QString *this_00;
  QHash<QFontDatabase::WritingSystem,_QString> *in_RDX;
  long in_FS_OFFSET;
  QFontComboBoxPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key = d_func((QFontComboBox *)0x59aa6e);
  this_00 = QHash<QFontDatabase::WritingSystem,_QString>::operator[](in_RDX,(WritingSystem *)key);
  QString::operator=(this_00,(QString *)in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontComboBox::setSampleTextForSystem(QFontDatabase::WritingSystem writingSystem, const QString &sampleText)
{
    Q_D(QFontComboBox);
    d->sampleTextForWritingSystem[writingSystem] = sampleText;
}